

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O1

shared_ptr<Liby::UdpSocket> __thiscall
Liby::EventLoopGroup::creatUdpServer(EventLoopGroup *this,string *host,string *service)

{
  _List_node_base *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Logger *this_00;
  string *in_RCX;
  int __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  shared_ptr<Liby::Socket> *__p;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  shared_ptr<Liby::UdpSocket> sVar3;
  SockPtr sockPtr;
  list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> eps;
  undefined1 local_42;
  bool local_41;
  shared_ptr<Liby::Socket> local_40;
  _List_node_base local_30;
  
  Resolver::resolve((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&local_30,service,
                    in_RCX);
  if (local_30._M_next == &local_30) {
    this_00 = Logger::getLogger();
    Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    *(undefined8 *)this = 0;
    *(undefined8 *)&(this->bf_).super__Function_base._M_functor = 0;
    _Var2._M_pi = extraout_RDX_01;
  }
  else {
    local_41 = true;
    local_40.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Socket *)0x0;
    __p = &local_40;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Socket,std::allocator<Liby::Socket>,Liby::Endpoint&,bool>
              (&local_40.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (Socket **)__p,(allocator<Liby::Socket> *)&local_42,
               (Endpoint *)(local_30._M_next + 1),&local_41);
    Socket::listen(local_40.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (int)__p,__n);
    std::__shared_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<Liby::UdpSocket>,Liby::EventLoop*&,std::shared_ptr<Liby::Socket>&>
              ((__shared_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2> *)this,
               (allocator<Liby::UdpSocket> *)&local_42,(EventLoop **)host[3]._M_dataplus._M_p,
               &local_40);
    UdpSocket::start(*(UdpSocket **)this);
    _Var2._M_pi = extraout_RDX;
    if (local_40.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  while (local_30._M_next != &local_30) {
    p_Var1 = (((_List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)
              &(local_30._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_30._M_next);
    _Var2._M_pi = extraout_RDX_02;
    local_30._M_next = p_Var1;
  }
  sVar3.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::UdpSocket>)
         sVar3.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UdpSocket>
EventLoopGroup::creatUdpServer(const std::string &host,
                               const std::string &service) {
    auto eps = Resolver::resolve(host, service);
    if (eps.empty()) {
        error("host or service unavaiable");
        return nullptr;
    }

    SockPtr sockPtr = std::make_shared<Socket>(eps.front(), true);
    sockPtr->listen();

    std::shared_ptr<UdpSocket> udpSocket =
        std::make_shared<UdpSocket>(ploops_[0], sockPtr);
    udpSocket->start();

    return udpSocket;
}